

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O3

uint128 * __thiscall trng::portable_impl::uint128::operator*=(uint128 *this,uint128 other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = this->m_lo;
  uVar2 = this->m_hi;
  uVar7 = uVar1 & 0xffffffff;
  uVar10 = (ulong)(uint)other.m_lo;
  uVar6 = other.m_lo >> 0x20;
  uVar3 = (uVar1 >> 0x20) * uVar10;
  uVar4 = uVar3 << 0x20;
  uVar5 = uVar4 + uVar7 * uVar10;
  uVar8 = uVar7 * uVar6;
  uVar9 = uVar8 << 0x20;
  this->m_lo = uVar9 + uVar5;
  this->m_hi = (uVar1 >> 0x20) * uVar6 + (uint)other.m_hi * uVar7 + (uVar8 >> 0x20) +
               (uVar2 & 0xffffffff) * uVar10 + (uVar3 >> 0x20) + (ulong)CARRY8(uVar4,uVar7 * uVar10)
               + (ulong)CARRY8(uVar9,uVar5) +
               ((ulong)((int)(uVar1 >> 0x20) * (uint)other.m_hi +
                        other.m_lo._4_4_ * (int)uVar2 + other.m_hi._4_4_ * (int)uVar1 +
                       (int)(uVar2 >> 0x20) * (uint)other.m_lo) << 0x20);
  return this;
}

Assistant:

uint128 &operator*=(uint128 other) {
        const auto lo0{m_lo & 0xffffffff};
        const auto lo1{m_lo >> 32};
        const auto hi0{m_hi & 0xffffffff};
        const auto hi1{m_hi >> 32};

        const auto other_lo0{other.m_lo & 0xffffffff};
        const auto other_lo1{other.m_lo >> 32};
        const auto other_hi0{other.m_hi & 0xffffffff};
        const auto other_hi1{other.m_hi >> 32};

        const uint128 m0{0, lo0 * other_lo0};
        *this = m0;
        const uint128 m1{(lo1 * other_lo0) >> 32, (lo1 * other_lo0) << 32};
        *this += m1;
        const uint128 m2{(lo0 * other_lo1) >> 32, (lo0 * other_lo1) << 32};
        *this += m2;
        const std::uint64_t m3{hi0 * other_lo0};
        this->m_hi += m3;
        const std::uint64_t m4{lo0 * other_hi0};
        this->m_hi += m4;
        const std::uint64_t m5{lo1 * other_lo1};
        this->m_hi += m5;
        const std::uint64_t m6{(hi1 * other_lo0) << 32};
        this->m_hi += m6;
        const std::uint64_t m7{(lo0 * other_hi1) << 32};
        this->m_hi += m7;
        const std::uint64_t m8{(hi0 * other_lo1) << 32};
        this->m_hi += m8;
        const std::uint64_t m9{(lo1 * other_hi0) << 32};
        this->m_hi += m9;
        return *this;
      }